

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pareto_dist.hpp
# Opt level: O0

result_type_conflict3 * __thiscall
trng::pareto_dist<long_double>::cdf(pareto_dist<long_double> *this,result_type_conflict3 x)

{
  param_type *extraout_RAX;
  param_type *in_RSI;
  param_type *in_RDI;
  double extraout_XMM0_Qa;
  double __x;
  double in_XMM1_Qa;
  longdouble in_stack_00000008;
  
  if ((longdouble)0 < in_stack_00000008) {
    param_type::theta(&in_RDI->gamma_,in_RSI);
    __x = param_type::gamma(in_RDI,extraout_XMM0_Qa);
    std::pow(__x,in_XMM1_Qa);
    in_RDI = extraout_RAX;
  }
  return &in_RDI->gamma_;
}

Assistant:

result_type cdf(result_type x) const {
      if (x <= 0)
        return 0;
      return 1 - math::pow(1 + x / P.theta(), -P.gamma());
    }